

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  
  iVar1 = 0;
  cVar4 = '\0';
  iVar5 = 1;
switchD_00461eaf_caseD_4:
  iVar2 = iVar5;
  pcVar3 = ptr;
  ptr = pcVar3 + 1;
  iVar5 = iVar2;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar3[1])) {
  case 3:
    if (iVar1 < attsMax) {
      atts[iVar1].normalized = '\0';
    }
  default:
    goto switchD_00461eaf_caseD_4;
  case 5:
    if ((iVar2 == 0) && (iVar2 = 1, iVar1 < attsMax)) {
      atts[iVar1].name = ptr;
      atts[iVar1].normalized = '\x01';
    }
    ptr = pcVar3 + 2;
    iVar5 = iVar2;
    goto switchD_00461eaf_caseD_4;
  case 6:
    if ((iVar2 == 0) && (iVar2 = 1, iVar1 < attsMax)) {
      atts[iVar1].name = ptr;
      atts[iVar1].normalized = '\x01';
    }
    ptr = pcVar3 + 3;
    iVar5 = iVar2;
    goto switchD_00461eaf_caseD_4;
  case 7:
    if ((iVar2 == 0) && (iVar2 = 1, iVar1 < attsMax)) {
      atts[iVar1].name = ptr;
      atts[iVar1].normalized = '\x01';
    }
    ptr = pcVar3 + 4;
    iVar5 = iVar2;
    goto switchD_00461eaf_caseD_4;
  case 9:
  case 10:
    iVar5 = 0;
    if (((iVar2 != 1) && (iVar5 = iVar2, iVar2 == 2)) && (iVar5 = 2, iVar1 < attsMax)) {
      atts[iVar1].normalized = '\0';
    }
    goto switchD_00461eaf_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00461eaf_caseD_b;
  case 0xc:
    if (iVar2 == 2) {
      iVar5 = 2;
      if (cVar4 == '\f') {
        if (iVar1 < attsMax) {
          atts[iVar1].valueEnd = ptr;
        }
        iVar1 = iVar1 + 1;
        cVar4 = '\f';
        iVar5 = 0;
      }
      goto switchD_00461eaf_caseD_4;
    }
    cVar4 = '\f';
    break;
  case 0xd:
    if (iVar2 == 2) {
      iVar5 = 2;
      if (cVar4 == '\r') {
        if (iVar1 < attsMax) {
          atts[iVar1].valueEnd = ptr;
        }
        iVar1 = iVar1 + 1;
        cVar4 = '\r';
        iVar5 = 0;
      }
      goto switchD_00461eaf_caseD_4;
    }
    cVar4 = '\r';
    break;
  case 0x15:
    iVar5 = 0;
    if (((((iVar2 != 1) && (iVar5 = iVar2, iVar2 == 2)) && (iVar5 = 2, iVar1 < attsMax)) &&
        (atts[iVar1].normalized != '\0')) &&
       (((pcVar3[1] != 0x20 || (ptr == atts[iVar1].valuePtr)) ||
        (((ulong)(byte)pcVar3[2] == 0x20 ||
         (cVar4 == *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar3[2]))))))) {
      atts[iVar1].normalized = '\0';
    }
    goto switchD_00461eaf_caseD_4;
  case 0x16:
  case 0x18:
  case 0x1d:
    if ((iVar2 == 0) && (iVar5 = 1, iVar1 < attsMax)) {
      atts[iVar1].name = ptr;
      atts[iVar1].normalized = '\x01';
      iVar5 = 1;
    }
    goto switchD_00461eaf_caseD_4;
  }
  iVar5 = 2;
  if (iVar1 < attsMax) {
    atts[iVar1].valuePtr = pcVar3 + 2;
  }
  goto switchD_00461eaf_caseD_4;
switchD_00461eaf_caseD_b:
  iVar5 = 2;
  if (iVar2 != 2) {
    return iVar1;
  }
  goto switchD_00461eaf_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr,
                int attsMax, ATTRIBUTE *atts)
{
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define START_NAME \
      if (state == other) { \
        if (nAtts < attsMax) { \
          atts[nAtts].name = ptr; \
          atts[nAtts].normalized = 1; \
        } \
        state = inName; \
      }
#define LEAD_CASE(n) \
    case BT_LEAD ## n: START_NAME ptr += (n - MINBPC(enc)); break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      }
      else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      }
      else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue
               && nAtts < attsMax
               && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR: case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}